

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void setSubscriptionSettings
               (UA_Server *server,UA_Subscription *subscription,
               UA_Double requestedPublishingInterval,UA_UInt32 requestedLifetimeCount,
               UA_UInt32 requestedMaxKeepAliveCount,UA_UInt32 maxNotificationsPerPublish,
               UA_Byte priority)

{
  uint uVar1;
  double dVar2;
  
  Subscription_unregisterPublishJob(server,subscription);
  dVar2 = (server->config).publishingIntervalLimits.max;
  if ((requestedPublishingInterval <= dVar2) &&
     (dVar2 = (server->config).publishingIntervalLimits.min, dVar2 <= requestedPublishingInterval))
  {
    dVar2 = requestedPublishingInterval;
  }
  subscription->publishingInterval = dVar2;
  if (NAN(requestedPublishingInterval)) {
    subscription->publishingInterval = (server->config).publishingIntervalLimits.min;
  }
  uVar1 = (server->config).keepAliveCountLimits.max;
  if ((uVar1 < requestedMaxKeepAliveCount) ||
     (uVar1 = (server->config).keepAliveCountLimits.min, requestedMaxKeepAliveCount < uVar1)) {
    subscription->maxKeepAliveCount = uVar1;
    requestedMaxKeepAliveCount = uVar1;
  }
  else {
    subscription->maxKeepAliveCount = requestedMaxKeepAliveCount;
  }
  uVar1 = (server->config).lifeTimeCountLimits.max;
  if ((uVar1 < requestedLifetimeCount) ||
     (uVar1 = (server->config).lifeTimeCountLimits.min, requestedLifetimeCount < uVar1)) {
    subscription->lifeTimeCount = uVar1;
    requestedLifetimeCount = uVar1;
  }
  else {
    subscription->lifeTimeCount = requestedLifetimeCount;
  }
  if (requestedLifetimeCount < requestedMaxKeepAliveCount * 3) {
    subscription->lifeTimeCount = requestedMaxKeepAliveCount * 3;
  }
  subscription->notificationsPerPublish = maxNotificationsPerPublish;
  uVar1 = (server->config).maxNotificationsPerPublish;
  if (maxNotificationsPerPublish - 1 < uVar1) {
    uVar1 = maxNotificationsPerPublish;
  }
  subscription->notificationsPerPublish = uVar1;
  subscription->priority = (uint)priority;
  Subscription_registerPublishJob(server,subscription);
  return;
}

Assistant:

static void
setSubscriptionSettings(UA_Server *server, UA_Subscription *subscription,
                        UA_Double requestedPublishingInterval,
                        UA_UInt32 requestedLifetimeCount,
                        UA_UInt32 requestedMaxKeepAliveCount,
                        UA_UInt32 maxNotificationsPerPublish, UA_Byte priority) {
    /* deregister the job if required */
    UA_StatusCode retval = Subscription_unregisterPublishJob(server, subscription);
    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_DEBUG_SESSION(server->config.logger, subscription->session, "Subscription %u | "
                             "Could not unregister publish job with error code 0x%08x",
                             subscription->subscriptionID, retval);

    /* re-parameterize the subscription */
    subscription->publishingInterval = requestedPublishingInterval;
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.publishingIntervalLimits,
                               requestedPublishingInterval, subscription->publishingInterval);
    /* check for nan*/
    if(requestedPublishingInterval != requestedPublishingInterval)
        subscription->publishingInterval = server->config.publishingIntervalLimits.min;
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.keepAliveCountLimits,
                               requestedMaxKeepAliveCount, subscription->maxKeepAliveCount);
    UA_BOUNDEDVALUE_SETWBOUNDS(server->config.lifeTimeCountLimits,
                               requestedLifetimeCount, subscription->lifeTimeCount);
    if(subscription->lifeTimeCount < 3 * subscription->maxKeepAliveCount)
        subscription->lifeTimeCount = 3 * subscription->maxKeepAliveCount;
    subscription->notificationsPerPublish = maxNotificationsPerPublish;
    if(maxNotificationsPerPublish == 0 ||
       maxNotificationsPerPublish > server->config.maxNotificationsPerPublish)
        subscription->notificationsPerPublish = server->config.maxNotificationsPerPublish;
    subscription->priority = priority;

    retval = Subscription_registerPublishJob(server, subscription);
    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_DEBUG_SESSION(server->config.logger, subscription->session, "Subscription %u | "
                             "Could not register publish job with error code 0x%08x",
                             subscription->subscriptionID, retval);
}